

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::TokenManager::ParsePrivateKey
          (Error *__return_storage_ptr__,TokenManager *this,mbedtls_pk_context_conflict *aPrivateKey
          ,ByteArray *aPrivateKeyRaw)

{
  string *this_00;
  uchar *key;
  uchar *puVar1;
  pointer pcVar2;
  int aMbedtlsError;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  parse_func local_80 [1];
  string local_70;
  ErrorCode local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  key = (aPrivateKeyRaw->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (aPrivateKeyRaw->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (key == puVar1) {
    local_a8._0_4_ = none_type;
    local_a0._M_p = "the raw private key is empty";
    local_98 = 0x1c;
    local_90._M_allocated_capacity = 0;
    local_80[0] = (parse_func)0x0;
    begin = "the raw private key is empty";
    local_90._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_a8;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_a8);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_70,(v10 *)"the raw private key is empty",(string_view)ZEXT816(0x1c),args);
    local_50 = kInvalidArgs;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    __return_storage_ptr__->mCode = local_50;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    aMbedtlsError =
         mbedtls_pk_parse_key
                   ((mbedtls_pk_context *)aPrivateKey,key,(long)puVar1 - (long)key,(uchar *)0x0,0,
                    mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (aMbedtlsError == 0) {
      return __return_storage_ptr__;
    }
    ErrorFromMbedtlsError((Error *)local_a8,aMbedtlsError);
    __return_storage_ptr__->mCode = local_a8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p);
    }
    local_a8._0_4_ = uint_type;
    pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,
               pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
    __return_storage_ptr__->mCode = local_a8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
    local_70._M_dataplus._M_p = local_a0._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p == &local_90) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_70._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ParsePrivateKey(mbedtls_pk_context &aPrivateKey, const ByteArray &aPrivateKeyRaw)
{
    Error error;

    VerifyOrExit(!aPrivateKeyRaw.empty(), error = ERROR_INVALID_ARGS("the raw private key is empty"));
    if (int fail = mbedtls_pk_parse_key(&aPrivateKey, aPrivateKeyRaw.data(), aPrivateKeyRaw.size(), nullptr, 0,
                                        mbedtls_ctr_drbg_random, &mCtrDrbg))
    {
        error = ErrorFromMbedtlsError(fail);
        ExitNow(error = {ErrorCode::kInvalidArgs, error.GetMessage()});
    }

exit:
    return error;
}